

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O3

void __thiscall
cmsys::Encoding::CommandLineArguments::CommandLineArguments
          (CommandLineArguments *this,CommandLineArguments *other)

{
  char *pcVar1;
  ulong uVar2;
  pointer ppcVar3;
  
  (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char_*,_std::allocator<char_*>_>::resize
            (&this->argv_,
             (long)(other->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(other->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  ppcVar3 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar3) {
    uVar2 = 0;
    do {
      pcVar1 = (other->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2];
      if (pcVar1 == (char *)0x0) {
        pcVar1 = (char *)0x0;
      }
      else {
        pcVar1 = strdup(pcVar1);
      }
      ppcVar3[uVar2] = pcVar1;
      uVar2 = uVar2 + 1;
      ppcVar3 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar3 >> 3))
    ;
  }
  return;
}

Assistant:

Encoding::CommandLineArguments::
  CommandLineArguments(const CommandLineArguments& other)
{
  this->argv_.resize(other.argv_.size());
  for(size_t i=0; i<this->argv_.size(); i++)
    {
    this->argv_[i] = other.argv_[i] ? strdup(other.argv_[i]) : 0;
    }
}